

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3db66::time_zone_setter::time_zone_setter(time_zone_setter *this,czstring tz)

{
  undefined8 *puVar1;
  not_null<const_char_*> __value;
  char *__s;
  size_t sVar2;
  int __replace;
  not_null<const_char_*> local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  not_null<const_char_*> local_38;
  
  __s = getenv("TZ");
  if (__s == (char *)0x0) {
    *(undefined8 *)((long)&(this->old_).storage_ + 8) = 0;
    *(undefined8 *)((long)&(this->old_).storage_ + 0x10) = 0;
    *(undefined8 *)&this->old_ = 0;
    (this->old_).storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&(this->old_).storage_ + 0x18) = 0;
  }
  else {
    local_58.ptr_ = (char *)&local_48;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar2);
    (this->old_).valid_ = true;
    puVar1 = (undefined8 *)((long)&(this->old_).storage_ + 0x10);
    *(undefined8 **)&(this->old_).storage_ = puVar1;
    if (local_58.ptr_ == (char *)&local_48) {
      *puVar1 = local_48;
      *(undefined8 *)((long)&(this->old_).storage_ + 0x18) = uStack_40;
    }
    else {
      (this->old_).storage_.__align = (anon_struct_8_0_00000001_for___align)local_58.ptr_;
      *(undefined8 *)((long)&(this->old_).storage_ + 0x10) = local_48;
    }
    *(undefined8 *)((long)&(this->old_).storage_ + 8) = local_50;
  }
  local_38.ptr_ = tz;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_38);
  __value.ptr_ = local_38.ptr_;
  local_58.ptr_ = "TZ";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_58);
  setenv(local_58.ptr_,__value.ptr_,__replace);
  return;
}

Assistant:

time_zone_setter::time_zone_setter (czstring tz)
            : old_ (time_zone_setter::tz_value ()) {
        time_zone_setter::set_tz (tz);
    }